

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall cs::token_parallel::dump(token_parallel *this,ostream *o)

{
  bool bVar1;
  ostream *in_RSI;
  _Self *in_RDI;
  tree_type<cs::token_base_*> *tree;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range1;
  _Self *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_const_cs::tree_type<cs::token_base_*>_&,_const_cs::tree_type<cs::token_base_*>_*>
  local_38;
  _Elt_pointer *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"< ParallelList = {");
  local_18 = &in_RDI->_M_last;
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_ffffffffffffff88);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *)
      in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_const_cs::tree_type<cs::token_base_*>_&,_const_cs::tree_type<cs::token_base_*>_*>
    ::operator*(&local_38);
    std::operator<<(local_10,"< ChildExpression: ");
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff88);
    compiler_type::dump_expr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::operator<<(local_10," >");
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_const_cs::tree_type<cs::token_base_*>_&,_const_cs::tree_type<cs::token_base_*>_*>
    ::operator++(in_RDI);
  }
  std::operator<<(local_10,"} >");
  return true;
}

Assistant:

bool token_parallel::dump(std::ostream &o) const
	{
		o << "< ParallelList = {";
		for (auto &tree: mTreeList) {
			o << "< ChildExpression: ";
			compiler_type::dump_expr(tree.root(), o);
			o << " >";
		}
		o << "} >";
		return true;
	}